

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quest.c
# Opt level: O0

int s3parse_comp_quest(pset_t *pset,uint32 n_pset,comp_quest_t *q,char *in_str)

{
  uint32 uVar1;
  ushort **ppuVar2;
  quest_t **ppqVar3;
  uint32 *puVar4;
  bool bVar5;
  uint local_3c;
  byte *pbStack_38;
  uint32 i;
  char *s;
  char *in_str_local;
  comp_quest_t *q_local;
  uint32 n_pset_local;
  pset_t *pset_local;
  
  pbStack_38 = (byte *)in_str;
  while( true ) {
    bVar5 = false;
    if (*pbStack_38 != 0) {
      ppuVar2 = __ctype_b_loc();
      bVar5 = ((*ppuVar2)[(int)(uint)*pbStack_38] & 0x2000) != 0;
    }
    if (!bVar5) break;
    pbStack_38 = pbStack_38 + 1;
  }
  if (*pbStack_38 == 0) {
    err_msg(ERR_ERROR,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libcommon/quest.c"
            ,0x107,"Empty string seen for composite question\n");
    pset_local._4_4_ = -1;
  }
  else if (*pbStack_38 == 0x28) {
    uVar1 = s3cnt_q_term(in_str);
    q->sum_len = uVar1;
    ppqVar3 = (quest_t **)
              __ckd_calloc__((ulong)q->sum_len,8,
                             "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libcommon/quest.c"
                             ,0x114);
    q->conj_q = ppqVar3;
    puVar4 = (uint32 *)
             __ckd_calloc__((ulong)q->sum_len,4,
                            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libcommon/quest.c"
                            ,0x115);
    q->prod_len = puVar4;
    pbStack_38 = pbStack_38 + 1;
    local_3c = 0;
    do {
      pbStack_38 = (byte *)s3parse_conj(pset,n_pset,q->conj_q + local_3c,q->prod_len + local_3c,
                                        (char *)pbStack_38);
      local_3c = local_3c + 1;
      bVar5 = false;
      if ((pbStack_38 != (byte *)0x0) && (bVar5 = false, *pbStack_38 != 0)) {
        bVar5 = *pbStack_38 == 0x28;
      }
    } while (bVar5);
    if (pbStack_38 == (byte *)0x0) {
      err_msg(ERR_ERROR,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libcommon/quest.c"
              ,0x124,"Error while parsing %s\n",in_str);
      pset_local._4_4_ = -1;
    }
    else {
      pset_local._4_4_ = 0;
    }
  }
  else {
    err_msg(ERR_ERROR,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libcommon/quest.c"
            ,0x10e,"Composite question does not begin with \'(\' : %s\n",in_str);
    pset_local._4_4_ = -1;
  }
  return pset_local._4_4_;
}

Assistant:

int
s3parse_comp_quest(pset_t *pset,
		   uint32 n_pset,
		   comp_quest_t *q,
		   char *in_str)
{
    char *s;
    uint32 i;

    s = in_str;

    for (; *s != '\0' && isspace((unsigned char)*s); s++);

    if (*s == '\0') {
	E_ERROR("Empty string seen for composite question\n");

	return S3_ERROR;
    }

    if (*s != '(') {
	E_ERROR("Composite question does not begin with '(' : %s\n",
		in_str);
	
	return S3_ERROR;
    }
	
    q->sum_len  = s3cnt_q_term(in_str);
    q->conj_q   = (quest_t **)ckd_calloc(q->sum_len, sizeof(quest_t *));
    q->prod_len = (uint32 *)ckd_calloc(q->sum_len, sizeof(uint32));

    ++s;	/* skip the open paren */

    i = 0;
    do {
	s = s3parse_conj(pset,
			 n_pset,
			 &q->conj_q[i],
			 &q->prod_len[i],
			 s);
	++i;
    } while (s && *s && *s == '(');

    if (s == NULL) {
	E_ERROR("Error while parsing %s\n", in_str);

	return S3_ERROR;
    }

    return S3_SUCCESS;
}